

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorLineEdit.cpp
# Opt level: O0

void __thiscall QColorLineEditPrivate::editingFinished(QColorLineEditPrivate *this)

{
  bool bVar1;
  long in_RDI;
  QColor QVar2;
  QColor color;
  QString *in_stack_ffffffffffffff28;
  QColor *in_stack_ffffffffffffff30;
  QString *pQVar3;
  QColorAction *this_00;
  QColorAction *this_01;
  QColor *in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffae;
  undefined6 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb6;
  QColorAction local_48 [2];
  QColor local_18;
  
  QLineEdit::text();
  QColor::QColor(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  QString::~QString((QString *)0x212a03);
  bVar1 = QColor::isValid(&local_18);
  if (bVar1) {
    QColorAction::setColor
              ((QColorAction *)CONCAT26(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0),
               (QColor *)CONCAT26(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8));
  }
  else {
    this_00 = *(QColorAction **)(in_RDI + 0x20);
    QVar2 = QColorAction::color(this_00);
    this_01 = local_48;
    QColorAction::colorIcon(QVar2._0_8_,in_stack_ffffffffffffff90);
    QAction::setIcon((QIcon *)this_00);
    QIcon::~QIcon((QIcon *)local_48);
    pQVar3 = *(QString **)(in_RDI + 0x10);
    QColorAction::color(*(QColorAction **)(in_RDI + 0x20));
    QColorAction::colorName(this_01,(QColor *)this_00);
    QLineEdit::setText(pQVar3);
    QString::~QString((QString *)0x212b37);
  }
  return;
}

Assistant:

void editingFinished() {
        const QColor color = QColor(widget->text());

        if (color.isValid()) {
            action->setColor(color);
        } else {
            action->setIcon(action->colorIcon(action->color()));
            widget->setText(action->colorName(action->color()));
        }
    }